

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

ON_3dPoint * __thiscall
ON_HermiteSurface::PointAt(ON_3dPoint *__return_storage_ptr__,ON_HermiteSurface *this,int u,int v)

{
  bool bVar1;
  ON_SimpleArray<ON_3dPoint> *this_00;
  ON_3dPoint *pOVar2;
  int v_local;
  int u_local;
  ON_HermiteSurface *this_local;
  
  __return_storage_ptr__->x = ON_3dPoint::UnsetPoint.x;
  __return_storage_ptr__->y = ON_3dPoint::UnsetPoint.y;
  __return_storage_ptr__->z = ON_3dPoint::UnsetPoint.z;
  bVar1 = InBounds(this,u,v);
  if (bVar1) {
    this_00 = ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::operator[](&this->m_grid_points,u);
    pOVar2 = ON_SimpleArray<ON_3dPoint>::operator[](this_00,v);
    __return_storage_ptr__->x = pOVar2->x;
    __return_storage_ptr__->y = pOVar2->y;
    __return_storage_ptr__->z = pOVar2->z;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_HermiteSurface::PointAt(int u, int v) const
{
  ON_3dPoint rc = ON_3dPoint::UnsetPoint;
  if (InBounds(u, v))
    rc = m_grid_points[u][v];
  return rc;
}